

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_free_ref(void)

{
  fsnav_ref *pfVar1;
  double *__ptr;
  
  if (fsnav->ref != (fsnav_ref *)0x0) {
    fsnav->ref->cfg = (char *)0x0;
    pfVar1 = fsnav->ref;
    pfVar1->cfglength = 0;
    __ptr = (pfVar1->sol).metrics;
    if (__ptr != (double *)0x0) {
      free(__ptr);
      (pfVar1->sol).metrics = (double *)0x0;
    }
    free(fsnav->ref);
    fsnav->ref = (fsnav_ref *)0x0;
  }
  return;
}

Assistant:

void fsnav_free_ref(void)
{
	if (fsnav->ref == NULL)
		return;

	// configuration
	fsnav->ref->cfg = NULL;
	fsnav->ref->cfglength = 0;

	// solution
	fsnav_free_sol(&(fsnav->ref->sol));
	
	// fsnav_ref structure
	free((void*)(fsnav->ref));
	fsnav->ref = NULL;
}